

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpgen.cpp
# Opt level: O2

Vector2 __thiscall cp::cpgen::calcEndCP(cpgen *this,Pose *ref_land_pose)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  long in_RDX;
  double dVar4;
  double in_XMM1_Qa;
  Vector2 VVar5;
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  local_30 [16];
  
  Eigen::DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::Zero();
  Eigen::PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>> *)this,local_30);
  uVar1 = *(uint *)&ref_land_pose[10].field_0x18;
  iVar2 = *(int *)&ref_land_pose[10].field_0x1c;
  lVar3 = (ulong)uVar1 * 0xe0;
  *(double *)this =
       *(double *)(in_RDX + lVar3) +
       ref_land_pose[10].qq.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
       m_storage.m_data.array[0];
  if (iVar2 - 3U < 2) {
    dVar4 = (*(double *)(in_RDX + 8) + *(double *)(in_RDX + 0xe8)) * 0.5;
  }
  else {
    dVar4 = ref_land_pose[10].qq.m_coeffs.
            super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1];
    if (uVar1 != 0) {
      in_XMM1_Qa = *(double *)(in_RDX + lVar3 + 8) - dVar4;
      *(double *)(this + 8) = in_XMM1_Qa;
      goto LAB_0012d09d;
    }
    dVar4 = dVar4 + *(double *)(in_RDX + 8);
  }
  *(double *)(this + 8) = dVar4;
LAB_0012d09d:
  VVar5.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1] =
       in_XMM1_Qa;
  VVar5.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] =
       dVar4;
  return (Vector2)VVar5.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.
                  m_data.array;
}

Assistant:

Vector2 cpgen::calcEndCP(const Pose ref_land_pose[]) {

  Vector2 end_cp = Vector2::Zero();
  if (wstate == stopping2 || wstate == stopping1) {
    end_cp.x() = ref_land_pose[swingleg].p().x() + end_cp_offset[0];
    end_cp.y() = (ref_land_pose[0].p().y() + ref_land_pose[1].p().y()) * 0.5;
  } else {
    end_cp.x() = ref_land_pose[swingleg].p().x() + end_cp_offset[0];
    if (swingleg == right) {
      end_cp.y() = ref_land_pose[swingleg].p().y() + end_cp_offset[1];
    } else {
      end_cp.y() = ref_land_pose[swingleg].p().y() - end_cp_offset[1];
    }
  }
  return end_cp;
}